

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O3

float NormedCustomLoss2(vector<INeuron_*,_std::allocator<INeuron_*>_> *outputNeurons,Target classId,
                       vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  INeuron *this;
  iterator __position;
  pointer pfVar2;
  int iVar3;
  pointer ppIVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_4c;
  undefined1 local_48 [16];
  
  ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  fVar11 = 0.0;
  if (ppIVar4 != ppIVar1) {
    uVar8 = 0;
    do {
      this = *ppIVar4;
      iVar3 = INeuron::GetOutputSpikeCounter(this);
      if (uVar8 < (ulong)(long)iVar3) {
        iVar3 = INeuron::GetOutputSpikeCounter(this);
        uVar8 = (ulong)iVar3;
      }
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 != ppIVar1);
    ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    fVar11 = 0.0;
    if ((outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppIVar4) {
      fVar11 = 0.0;
      uVar9 = 0;
      do {
        uVar10 = -(uint)(ABS(classId - (float)(int)uVar9) < 1e-05);
        fVar12 = 0.0;
        if (uVar8 != 0) {
          local_48 = ZEXT416(uVar10);
          iVar3 = INeuron::GetOutputSpikeCounter(ppIVar4[uVar9]);
          fVar12 = (float)iVar3 / (float)uVar8;
          uVar10 = local_48._0_4_;
        }
        local_4c = fVar12 - (float)(uVar10 & 0x3f800000);
        __position._M_current =
             (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (deltas,__position,&local_4c);
          pfVar7 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = local_4c;
          pfVar7 = __position._M_current + 1;
          (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = pfVar7;
        }
        fVar11 = fVar11 + pfVar7[-1] * pfVar7[-1];
        uVar9 = uVar9 + 1;
        ppIVar4 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(outputNeurons->
                                     super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4 >> 3)
              );
    }
  }
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  fVar12 = 0.0;
  if ((1e-05 < fVar11) &&
     (lVar5 = (long)(outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>).
                    _M_impl.super__Vector_impl_data._M_start, fVar12 = 0.0, lVar5 != 0)) {
    lVar5 = lVar5 >> 3;
    pfVar2 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    fVar12 = 0.0;
    do {
      fVar13 = pfVar2[lVar6] / fVar11;
      pfVar2[lVar6] = fVar13;
      fVar12 = fVar13 * fVar13 * 0.5 + fVar12;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  return -fVar12;
}

Assistant:

float
NormedCustomLoss2( const std::vector<INeuron *> &outputNeurons, SPIKING_NN::Target classId, std::vector<float> &deltas )
{
    float loss = 0;
    size_t maxSpikes = 0;
    float s = 0;
    for ( auto neuron: outputNeurons ) {
        if ( neuron->GetOutputSpikeCounter() > maxSpikes ) {
            maxSpikes = neuron->GetOutputSpikeCounter();
        }
    }
    for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
        INeuron *neuron = outputNeurons[neuronId];
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        float output = maxSpikes ? static_cast<float>(neuron->GetOutputSpikeCounter()) / maxSpikes : 0;
        deltas.emplace_back( output - target );
        s += deltas.back() * deltas.back();
    }
    s = sqrt( s );
    if ( s > SPIKING_NN::EPS ) {
        for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
            deltas[neuronId] = deltas[neuronId] / s;
            loss += 0.5 * ( deltas[neuronId] * deltas[neuronId] );
        }
    }
    return -loss;
}